

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *returnvalue;
  long *plVar4;
  void *returnvalue_00;
  void *pvVar5;
  FILE *__s;
  bool bVar6;
  double dVar7;
  int retval;
  SUNContext ctx;
  sunrealtype t;
  double local_a8;
  MRIStepInnerStepper inner_stepper;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  FILE *local_70;
  void *local_68;
  long nfse;
  long nstf;
  long nsts;
  void *local_48;
  void *local_40;
  long nff;
  
  inner_stepper = (MRIStepInnerStepper)0x0;
  ctx = (SUNContext)0x0;
  retval = SUNContext_Create(0);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    puts("\nOne way coupling ODE test problem:");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0,0,0x4000000000000000);
    printf("    hs = %g,  hf = %g\n\n",0xd2f1a9fc,0x3f1a36e2eb1c432d);
    returnvalue = (long *)N_VNew_Serial(3,ctx);
    iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0;
      puVar1[2] = 0x4000000000000000;
      plVar4 = (long *)N_VClone(returnvalue);
      returnvalue_00 = (void *)ARKStepCreate(0,ff,0,returnvalue,ctx);
      local_48 = returnvalue_00;
      iVar2 = check_retval(returnvalue_00,"ARKStepCreate",0);
      if (iVar2 == 0) {
        retval = ARKStepSetTableNum(returnvalue_00,0xffffffffffffffff,0xc);
        iVar3 = 1;
        iVar2 = check_retval(&retval,"ARKStepSetTableNum",1);
        if (iVar2 == 0) {
          retval = ARKodeSetFixedStep(0xeb1c432d,returnvalue_00);
          iVar3 = 1;
          iVar2 = check_retval(&retval,"ARKodeSetFixedStep",1);
          if (iVar2 == 0) {
            retval = ARKodeCreateMRIStepInnerStepper(returnvalue_00,&inner_stepper);
            iVar3 = 1;
            iVar2 = check_retval(&retval,"ARKodeCreateMRIStepInnerStepper",1);
            if (iVar2 == 0) {
              pvVar5 = (void *)MRIStepCreate(0,fs,0,returnvalue,inner_stepper,ctx);
              local_40 = pvVar5;
              iVar2 = check_retval(pvVar5,"MRIStepCreate",0);
              if (iVar2 == 0) {
                retval = ARKodeSetFixedStep(0xd2f1a9fc,pvVar5);
                iVar3 = 1;
                iVar2 = check_retval(&retval,"ARKodeSetFixedStep",1);
                if (iVar2 == 0) {
                  local_68 = pvVar5;
                  __s = fopen("ark_onewaycouple_mri_solution.txt","w");
                  fwrite("# t u v w maxerr\n",0x11,1,__s);
                  puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                  local_70 = __s;
                  fprintf(__s," %.16e %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2],0);
                  t = 0.0;
                  puts("        t           u           v           w       max err");
                  puts("   ----------------------------------------------------------");
                  puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                  printf("  %10.6f  %10.6f  %10.6f  %10.6f  %10.6f\n",0,*puVar1,puVar1[1],puVar1[2],
                         0);
                  iVar2 = 10;
                  local_a8 = 0.1;
                  while( true ) {
                    bVar6 = iVar2 == 0;
                    iVar2 = iVar2 + -1;
                    if (bVar6) break;
                    retval = ARKodeEvolve(SUB84(local_a8,0),local_68,returnvalue,&t,1);
                    iVar3 = check_retval(&retval,"ARKodeEvolve",1);
                    if (iVar3 != 0) break;
                    local_88 = t;
                    uStack_80 = 0;
                    local_98 = t * 50.0;
                    uStack_90 = 0;
                    dVar7 = cos(local_98);
                    **(double **)(*plVar4 + 0x10) = dVar7;
                    dVar7 = sin(local_98);
                    *(double *)(*(long *)(*plVar4 + 0x10) + 8) = dVar7;
                    local_88 = exp(-local_88);
                    dVar7 = cos(local_98);
                    local_88 = local_88 * 2.019592163134746 + dVar7 * -0.019592163134746102;
                    dVar7 = sin(local_98);
                    *(double *)(*(long *)(*plVar4 + 0x10) + 0x10) =
                         dVar7 * 0.02039184326269492 + local_88;
                    retval = 0;
                    iVar3 = check_retval(&retval,"ans",1);
                    if (iVar3 != 0) break;
                    N_VLinearSum(0,0xbff0000000000000,returnvalue,plVar4,plVar4);
                    local_98 = (double)N_VMaxNorm(plVar4);
                    retval = 0;
                    iVar3 = check_retval(&retval,"err",1);
                    if (iVar3 != 0) break;
                    puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                    printf("  %10.6f  %10.6f  %10.6f  %10.6f  %10.6f\n",SUB84(t,0),*puVar1,puVar1[1]
                           ,puVar1[2],local_98);
                    puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                    fprintf(local_70," %.16e %.16e %.16e %.16e %.16e\n",SUB84(t,0),*puVar1,puVar1[1]
                            ,puVar1[2],local_98);
                    dVar7 = local_a8 + 0.1;
                    local_a8 = 1.0;
                    if (dVar7 <= 1.0) {
                      local_a8 = dVar7;
                    }
                  }
                  puts("   ----------------------------------------------------------");
                  fclose(local_70);
                  pvVar5 = local_68;
                  retval = ARKodeGetNumSteps(local_68,&nsts);
                  check_retval(&retval,"ARKodeGetNumSteps",1);
                  iVar3 = 0;
                  retval = ARKodeGetNumRhsEvals(pvVar5,0,&nfse);
                  check_retval(&retval,"ARKodeGetNumRhsEvals",1);
                  retval = ARKodeGetNumSteps(returnvalue_00,&nstf);
                  check_retval(&retval,"ARKodeGetNumSteps",1);
                  retval = ARKodeGetNumRhsEvals(returnvalue_00,0);
                  check_retval(&retval,"ARKodeGetNumRhsEvals",1);
                  puts("\nFinal Solver Statistics:");
                  printf("   Steps: nsts = %li, nstf = %li\n",nsts,nstf);
                  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",nfse,nff);
                  N_VDestroy(returnvalue);
                  N_VDestroy(plVar4);
                  ARKodeFree(&local_48);
                  MRIStepInnerStepper_Free(&inner_stepper);
                  ARKodeFree(&local_40);
                  SUNContext_Free(&ctx);
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(1.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.0001);    /* fast step size */
  sunrealtype u0, v0, w0;                    /* initial conditions */

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for the computed solution */
  N_Vector ytrue         = NULL; /* empty vector for the analytic solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE* UFID;
  sunrealtype t, tout;
  sunrealtype error = SUN_RCONST(0.0);
  int iout;
  long int nsts, nstf, nfse, nff;

  /*
   * Initialization
   */

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext ctx = NULL;
  retval         = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Set the initial contions */
  u0 = SUN_RCONST(1.0);
  v0 = SUN_RCONST(0.0);
  w0 = SUN_RCONST(2.0);

  /* Initial problem output */
  printf("\nOne way coupling ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    hs = %" GSYM ",  hf = %" GSYM "\n\n", hs, hf);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  NV_Ith_S(y, 0) = u0;
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Create serial vector for the analytic solution */
  ytrue = N_VClone(y);

  /*
   * Create the fast integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKodeCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKodeCreateMRIStepInnerStepper", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_onewaycouple_mri_solution.txt", "w");
  fprintf(UFID, "# t u v w maxerr\n");

  /* output initial condition to disk */
  fprintf(UFID,
          " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n",
          T0, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

  /* Main time-stepping loop: calls ARKodeEvolve to perform the
     integration, then prints results. Stops when the final time
     has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w       max err\n");
  printf("   ----------------------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
         "  %10.6" FSYM "\n",
         t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* compute the analytic solution */
    retval = ans(t, ytrue, NULL);
    if (check_retval(&retval, "ans", 1)) { break; }

    /* compute the error compared to the analytic solution */
    retval = err(y, ytrue, &error);
    if (check_retval(&retval, "err", 1)) { break; }

    /* access/print solution and error */
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "  %10.6" FSYM "\n",
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);
    fprintf(UFID,
            " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n",
            t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

    /* successful solve: update time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------------------\n");
  fclose(UFID);

  /*
   * Finalize
   */

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfse);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(inner_arkode_mem, 0, &nff);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Steps: nsts = %li, nstf = %li\n", nsts, nstf);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nff);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  N_VDestroy(ytrue);                        /* Free ytrue vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}